

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetictest.cpp
# Opt level: O2

void interpretCommandLineParameters
               (int argc,char **argv,int *stateCount,int *ntaxa,int *nsites,bool *manualScaling,
               bool *autoScaling,bool *dynamicScaling,int *rateCategoryCount,
               vector<int,_std::allocator<int>_> *rsrc,int *nreps,bool *fullTiming,
               bool *requireDoublePrecision,bool *disableVector,bool *enableThreads,
               int *compactTipCount,int *randomSeed,int *rescaleFrequency,bool *unrooted,
               bool *calcderivs,bool *logscalers,int *eigenCount,bool *eigencomplex,bool *ievectrans
               ,bool *setmatrix,bool *opencl,int *partitions,bool *sitelikes,bool *newDataPerRep,
               bool *randomTree,bool *rerootTrees,bool *pectinate,bool *benchmarklist,bool *pllTest,
               bool *pllSiteRepeats,bool *pllOnly,bool *multiRsrc,bool *postorderTraversal,
               bool *newTreePerRep,bool *newParametersPerRep,int *threadCount,char **alignmentdna,
               bool *compress,char **treenewick,bool *clientThreadingEnabled)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  long *plVar16;
  bool *pbVar17;
  undefined8 extraout_RAX;
  int *piVar18;
  ulong uVar19;
  int j;
  string option;
  stringstream ss;
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  bVar5 = false;
  bVar7 = false;
  bVar6 = false;
  bVar10 = false;
  bVar8 = false;
  bVar9 = false;
  bVar11 = false;
  bVar12 = false;
  bVar13 = false;
  for (uVar19 = 1; uVar19 < (uint)argc; uVar19 = uVar19 + 1) {
    std::__cxx11::string::string((string *)&option,argv[uVar19],(allocator *)&ss);
    if (bVar2) {
      iVar15 = atoi(option._M_dataplus._M_p);
      bVar2 = false;
      piVar18 = stateCount;
LAB_0010cb1a:
      *piVar18 = iVar15;
    }
    else {
      if (bVar3) {
        iVar15 = atoi(option._M_dataplus._M_p);
        bVar3 = false;
        piVar18 = ntaxa;
        goto LAB_0010cb1a;
      }
      if (bVar4) {
        iVar15 = atoi(option._M_dataplus._M_p);
        bVar4 = false;
        piVar18 = nsites;
        goto LAB_0010cb1a;
      }
      if (bVar5) {
        iVar15 = atoi(option._M_dataplus._M_p);
        bVar5 = false;
        piVar18 = rateCategoryCount;
        goto LAB_0010cb1a;
      }
      if (bVar6) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&option,_S_out|_S_in)
        ;
        while (plVar16 = (long *)std::istream::operator>>((istream *)&ss,&j),
              (*(byte *)((long)plVar16 + *(long *)(*plVar16 + -0x18) + 0x20) & 5) == 0) {
          std::vector<int,_std::allocator<int>_>::push_back(rsrc,&j);
          iVar15 = std::istream::peek();
          if (iVar15 == 0x2c) {
            std::istream::ignore();
          }
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        bVar6 = false;
        goto LAB_0010cb1c;
      }
      if (bVar7) {
        iVar15 = atoi(option._M_dataplus._M_p);
        bVar7 = false;
        piVar18 = nreps;
        goto LAB_0010cb1a;
      }
      if (bVar10) {
        iVar15 = atoi(option._M_dataplus._M_p);
        bVar10 = false;
        piVar18 = compactTipCount;
        goto LAB_0010cb1a;
      }
      if (bVar8) {
        iVar15 = atoi(option._M_dataplus._M_p);
        bVar8 = false;
        piVar18 = randomSeed;
        goto LAB_0010cb1a;
      }
      if (bVar9) {
        iVar15 = atoi(option._M_dataplus._M_p);
        bVar9 = false;
        piVar18 = rescaleFrequency;
        goto LAB_0010cb1a;
      }
      if (bVar11) {
        iVar15 = atoi(option._M_dataplus._M_p);
        bVar11 = false;
        piVar18 = eigenCount;
        goto LAB_0010cb1a;
      }
      if (bVar12) {
        iVar15 = atoi(option._M_dataplus._M_p);
        bVar12 = false;
        piVar18 = partitions;
        goto LAB_0010cb1a;
      }
      if (bVar13) {
        iVar15 = atoi(option._M_dataplus._M_p);
        bVar13 = false;
        piVar18 = threadCount;
        goto LAB_0010cb1a;
      }
      bVar13 = std::operator==(&option,"--help");
      if (bVar13) goto LAB_0010d9a9;
      bVar13 = std::operator==(&option,"--resourcelist");
      if (bVar13) goto LAB_0010d9a4;
      bVar13 = std::operator==(&option,"--benchmarklist");
      pbVar17 = benchmarklist;
      if ((((bVar13) ||
           (bVar13 = std::operator==(&option,"--manualscale"), pbVar17 = manualScaling, bVar13)) ||
          (bVar13 = std::operator==(&option,"--autoscale"), pbVar17 = autoScaling, bVar13)) ||
         ((bVar13 = std::operator==(&option,"--dynamicscale"), pbVar17 = dynamicScaling, bVar13 ||
          (bVar13 = std::operator==(&option,"--doubleprecision"), pbVar17 = requireDoublePrecision,
          bVar13)))) goto LAB_0010cd5a;
      bVar13 = std::operator==(&option,"--states");
      if (bVar13) {
        bVar2 = true;
LAB_0010cd5d:
        bVar13 = false;
      }
      else {
        bVar13 = std::operator==(&option,"--taxa");
        if (bVar13) {
          bVar3 = true;
          bVar13 = false;
        }
        else {
          bVar13 = std::operator==(&option,"--sites");
          if (bVar13) {
            bVar4 = true;
            bVar13 = false;
          }
          else {
            bVar13 = std::operator==(&option,"--rates");
            if (bVar13) {
              bVar5 = true;
              bVar13 = false;
            }
            else {
              bVar13 = std::operator==(&option,"--rsrc");
              if (bVar13) {
                bVar13 = false;
                bVar6 = true;
              }
              else {
                bVar13 = std::operator==(&option,"--reps");
                if (bVar13) {
                  bVar13 = false;
                  bVar7 = true;
                }
                else {
                  bVar13 = std::operator==(&option,"--compacttips");
                  if (bVar13) {
                    bVar13 = false;
                    bVar10 = true;
                  }
                  else {
                    bVar13 = std::operator==(&option,"--rescalefrequency");
                    if (bVar13) {
                      bVar13 = false;
                      bVar9 = true;
                    }
                    else {
                      bVar13 = std::operator==(&option,"--seed");
                      if (!bVar13) {
                        bVar13 = std::operator==(&option,"--fulltiming");
                        pbVar17 = fullTiming;
                        if (((!bVar13) &&
                            (bVar13 = std::operator==(&option,"--disablevector"),
                            pbVar17 = disableVector, !bVar13)) &&
                           ((bVar13 = std::operator==(&option,"--enablethreads"),
                            pbVar17 = enableThreads, !bVar13 &&
                            (((bVar13 = std::operator==(&option,"--unrooted"), pbVar17 = unrooted,
                              !bVar13 &&
                              (bVar13 = std::operator==(&option,"--calcderivs"),
                              pbVar17 = calcderivs, !bVar13)) &&
                             (bVar13 = std::operator==(&option,"--logscalers"), pbVar17 = logscalers
                             , !bVar13)))))) {
                          bVar13 = std::operator==(&option,"--eigencount");
                          if (bVar13) {
                            bVar13 = false;
                            bVar11 = true;
                            goto LAB_0010cb1c;
                          }
                          bVar13 = std::operator==(&option,"--eigencomplex");
                          pbVar17 = eigencomplex;
                          if (((!bVar13) &&
                              (bVar13 = std::operator==(&option,"--ievectrans"),
                              pbVar17 = ievectrans, !bVar13)) &&
                             ((bVar13 = std::operator==(&option,"--setmatrix"), pbVar17 = setmatrix,
                              !bVar13 &&
                              (bVar13 = std::operator==(&option,"--opencl"), pbVar17 = opencl,
                              !bVar13)))) {
                            bVar13 = std::operator==(&option,"--partitions");
                            if (bVar13) {
                              bVar13 = false;
                              bVar12 = true;
                              goto LAB_0010cb1c;
                            }
                            bVar13 = std::operator==(&option,"--sitelikes");
                            pbVar17 = sitelikes;
                            if (((!bVar13) &&
                                (bVar13 = std::operator==(&option,"--newdata"),
                                pbVar17 = newDataPerRep, !bVar13)) &&
                               (bVar13 = std::operator==(&option,"--randomtree"),
                               pbVar17 = randomTree, !bVar13)) {
                              bVar13 = std::operator==(&option,"--stdrand");
                              if (bVar13) {
                                useStdlibRand = true;
                                goto LAB_0010cd5d;
                              }
                              bVar13 = std::operator==(&option,"--reroot");
                              pbVar17 = rerootTrees;
                              if (((((!bVar13) &&
                                    (bVar13 = std::operator==(&option,"--pectinate"),
                                    pbVar17 = pectinate, !bVar13)) &&
                                   (bVar13 = std::operator==(&option,"--multirsrc"),
                                   pbVar17 = multiRsrc, !bVar13)) &&
                                  ((bVar13 = std::operator==(&option,"--postorder"),
                                   pbVar17 = postorderTraversal, !bVar13 &&
                                   (bVar13 = std::operator==(&option,"--newtree"),
                                   pbVar17 = newTreePerRep, !bVar13)))) &&
                                 (bVar13 = std::operator==(&option,"--newparameters"),
                                 pbVar17 = newParametersPerRep, !bVar13)) {
                                bVar14 = std::operator==(&option,"--threadcount");
                                bVar13 = true;
                                if (bVar14) goto LAB_0010cb1c;
                                bVar13 = std::operator==(&option,"--clientthreads");
                                pbVar17 = clientThreadingEnabled;
                                if (!bVar13) goto LAB_0010d9ae;
                              }
                            }
                          }
                        }
LAB_0010cd5a:
                        *pbVar17 = true;
                        goto LAB_0010cd5d;
                      }
                      bVar13 = false;
                      bVar8 = true;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_0010cb1c:
    std::__cxx11::string::~string((string *)&option);
  }
  if (bVar2) {
    std::__cxx11::string::string
              (local_70,
               "read last command line option without finding value associated with --states",
               (allocator *)&ss);
    abort();
LAB_0010d45b:
    std::__cxx11::string::string
              (local_90,"read last command line option without finding value associated with --taxa"
               ,(allocator *)&ss);
    abort();
LAB_0010d484:
    std::__cxx11::string::string
              (local_b0,
               "read last command line option without finding value associated with --sites",
               (allocator *)&ss);
    abort();
LAB_0010d4ad:
    std::__cxx11::string::string
              (local_d0,
               "read last command line option without finding value associated with --rates",
               (allocator *)&ss);
    abort();
LAB_0010d4d6:
    std::__cxx11::string::string
              (local_f0,"read last command line option without finding value associated with --rsrc"
               ,(allocator *)&ss);
    abort();
LAB_0010d4ff:
    std::__cxx11::string::string
              (local_110,
               "read last command line option without finding value associated with --reps",
               (allocator *)&ss);
    abort();
LAB_0010d528:
    std::__cxx11::string::string
              (local_130,
               "read last command line option without finding value associated with --seed",
               (allocator *)&ss);
    abort();
LAB_0010d551:
    std::__cxx11::string::string
              (local_150,
               "read last command line option without finding value associated with --rescalefrequency"
               ,(allocator *)&ss);
    abort();
LAB_0010d57a:
    std::__cxx11::string::string
              (local_170,
               "read last command line option without finding value associated with --compacttips",
               (allocator *)&ss);
    abort();
LAB_0010d5a3:
    std::__cxx11::string::string
              (local_190,
               "read last command line option without finding value associated with --eigencount",
               (allocator *)&ss);
    abort();
LAB_0010d5cc:
    std::__cxx11::string::string
              (local_1b0,
               "read last command line option without finding value associated with --partitions",
               (allocator *)&ss);
    abort();
LAB_0010d5f5:
    std::__cxx11::string::string
              (local_1d0,"invalid number of states supplied on the command line",(allocator *)&ss);
    abort();
LAB_0010d61e:
    std::__cxx11::string::string
              (local_1f0,"invalid number of taxa supplied on the command line",(allocator *)&ss);
    abort();
LAB_0010d647:
    std::__cxx11::string::string
              (local_210,"invalid number of sites supplied on the command line",(allocator *)&ss);
    abort();
LAB_0010d670:
    std::__cxx11::string::string
              (local_230,"invalid number of rates supplied on the command line",(allocator *)&ss);
    abort();
LAB_0010d699:
    std::__cxx11::string::string
              (local_250,"invalid number of reps supplied on the command line",(allocator *)&ss);
    abort();
LAB_0010d6c2:
    std::__cxx11::string::string
              (local_270,"invalid number for seed supplied on the command line",(allocator *)&ss);
    abort();
LAB_0010d6eb:
    std::__cxx11::string::string
              (local_2b0,"invalid number for compacttips supplied on the command line",
               (allocator *)&ss);
    abort();
LAB_0010d714:
    std::__cxx11::string::string
              (local_2f0,"invalid number for eigencount supplied on the command line",
               (allocator *)&ss);
    abort();
LAB_0010d73d:
    std::__cxx11::string::string
              (local_330,"invalid number for partitions supplied on the command line",
               (allocator *)&ss);
    abort();
LAB_0010d766:
    std::__cxx11::string::string
              (local_350,"random tree topology can only be used with eigencount=1 and rooted trees",
               (allocator *)&ss);
    abort();
LAB_0010d78f:
    std::__cxx11::string::string
              (local_290,"invalid number for rescalefrequency supplied on the command line",
               (allocator *)&ss);
    abort();
LAB_0010d7b8:
    std::__cxx11::string::string
              (local_2d0,"calcderivs option requires unrooted tree option",(allocator *)&ss);
    abort();
LAB_0010d7e1:
    std::__cxx11::string::string
              (local_310,"eigencomplex option only works with stateCount=4 and eigenCount=1",
               (allocator *)&ss);
    abort();
LAB_0010d80a:
    std::__cxx11::string::string
              (local_370,"multiple resources cannot be used with partitioning",(allocator *)&ss);
    abort();
LAB_0010d833:
    std::__cxx11::string::string
              (local_390,"multiple resources cannot be used with scaling",(allocator *)&ss);
    abort();
LAB_0010d85c:
    std::__cxx11::string::string
              (local_3b0,"multiple resources cannot be used with new data per replicate",
               (allocator *)&ss);
    abort();
LAB_0010d885:
    std::__cxx11::string::string
              (local_3d0,
               "multiple resources cannot be used with arbitrary transition matrix setting",
               (allocator *)&ss);
    abort();
LAB_0010d8ae:
    std::__cxx11::string::string
              (local_3f0,"multiple resources cannot be used with site likelihoods output",
               (allocator *)&ss);
    abort();
LAB_0010d8d7:
    std::__cxx11::string::string
              (local_410,"postorder traversal can only be used with randomtree option",
               (allocator *)&ss);
    abort();
LAB_0010d900:
    std::__cxx11::string::string
              (local_430,"new tree per replicate can only be used with randomtree option",
               (allocator *)&ss);
    abort();
LAB_0010d929:
    std::__cxx11::string::string
              (local_450,"new tree per replicate can only be used with eigencount=1",
               (allocator *)&ss);
    abort();
  }
  else {
    if (bVar3) goto LAB_0010d45b;
    if (bVar4) goto LAB_0010d484;
    if (bVar5) goto LAB_0010d4ad;
    if (bVar6) goto LAB_0010d4d6;
    if (bVar7) goto LAB_0010d4ff;
    if (bVar8) goto LAB_0010d528;
    if (bVar9) goto LAB_0010d551;
    if (bVar10) goto LAB_0010d57a;
    if (bVar11) goto LAB_0010d5a3;
    if (bVar12) goto LAB_0010d5cc;
    if (*stateCount < 2) goto LAB_0010d5f5;
    if (*ntaxa < 2) goto LAB_0010d61e;
    if (*nsites < 1) goto LAB_0010d647;
    if (*rateCategoryCount < 1) goto LAB_0010d670;
    if (*nreps < 1) goto LAB_0010d699;
    if (*randomSeed < 1) goto LAB_0010d6c2;
    if ((*manualScaling == true) && (*rescaleFrequency < 1)) goto LAB_0010d78f;
    if ((*compactTipCount < 0) || ((uint)*ntaxa < (uint)*compactTipCount)) goto LAB_0010d6eb;
    if ((*calcderivs == true) && (*unrooted == false)) goto LAB_0010d7b8;
    iVar15 = *eigenCount;
    if (iVar15 < 1) goto LAB_0010d714;
    if ((*eigencomplex == true) && ((*stateCount != 4 || (iVar15 != 1)))) goto LAB_0010d7e1;
    uVar1 = *partitions;
    if (((int)uVar1 < 1) || ((uint)*nsites < uVar1)) goto LAB_0010d73d;
    bVar13 = *randomTree;
    if ((bVar13 == true) && ((iVar15 != 1 || (*unrooted == true)))) goto LAB_0010d766;
    if ((uVar1 != 1) && (*multiRsrc == true)) goto LAB_0010d80a;
    if ((*manualScaling != false) && (*multiRsrc == true)) goto LAB_0010d833;
    if ((*newDataPerRep == true) && (*multiRsrc == true)) goto LAB_0010d85c;
    if ((*setmatrix == true) && (*multiRsrc == true)) goto LAB_0010d885;
    if ((*sitelikes == true) && (*multiRsrc == true)) goto LAB_0010d8ae;
    if ((*postorderTraversal == true) && (treenewick == (char **)0x0 && bVar13 == false))
    goto LAB_0010d8d7;
    if (*newTreePerRep == true) {
      if (bVar13 == false) goto LAB_0010d900;
      if (iVar15 == 1) {
        if (*unrooted == true) goto LAB_0010d97b;
        goto LAB_0010d40a;
      }
      goto LAB_0010d929;
    }
LAB_0010d40a:
    if ((*clientThreadingEnabled != true) || (*multiRsrc != false)) {
      return;
    }
  }
  std::__cxx11::string::string
            (local_490,"client-side threading requires \'multirsrc\' setting to be enabled",
             (allocator *)&ss);
  abort();
LAB_0010d97b:
  std::__cxx11::string::string
            (local_470,"new tree per replicate can only be used with rooted trees",(allocator *)&ss)
  ;
  abort();
LAB_0010d9a4:
  printResourceList();
LAB_0010d9a9:
  helpMessage();
LAB_0010d9ae:
  std::__cxx11::string::string((string *)&ss,"Unknown command line parameter \"",(allocator *)&j);
  std::__cxx11::string::append((string *)&ss);
  std::__cxx11::string::string(local_50,_ss,(allocator *)&j);
  abort();
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::~string((string *)&option);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void interpretCommandLineParameters(int argc, const char* argv[],
                                    int* stateCount,
                                    int* ntaxa,
                                    int* nsites,
                                    bool* manualScaling,
                                    bool* autoScaling,
                                    bool* dynamicScaling,
                                    int* rateCategoryCount,
                                    std::vector<int>* rsrc,
                                    int* nreps,
                                    bool* fullTiming,
                                    bool* requireDoublePrecision,
                                    bool* disableVector,
                                    bool* enableThreads,
                                    int* compactTipCount,
                                    int* randomSeed,
                                    int* rescaleFrequency,
                                    bool* unrooted,
                                    bool* calcderivs,
                                    bool* logscalers,
                                    int* eigenCount,
                                    bool* eigencomplex,
                                    bool* ievectrans,
                                    bool* setmatrix,
                                    bool* opencl,
                                    int*  partitions,
                                    bool* sitelikes,
                                    bool* newDataPerRep,
                                    bool* randomTree,
                                    bool* rerootTrees,
                                    bool* pectinate,
                                    bool* benchmarklist,
                                    bool* pllTest,
                                    bool* pllSiteRepeats,
                                    bool* pllOnly,
                                    bool* multiRsrc,
                                    bool* postorderTraversal,
                                    bool* newTreePerRep,
                                    bool* newParametersPerRep,
                                    int* threadCount,
                                    char** alignmentdna,
                                    bool* compress,
                                    char** treenewick,
                                    bool* clientThreadingEnabled)    {
    bool expecting_stateCount = false;
    bool expecting_ntaxa = false;
    bool expecting_nsites = false;
    bool expecting_rateCategoryCount = false;
    bool expecting_nreps = false;
    bool expecting_rsrc = false;
    bool expecting_compactTipCount = false;
    bool expecting_seed = false;
    bool expecting_rescaleFrequency = false;
    bool expecting_eigenCount = false;
    bool expecting_partitions = false;
    bool expecting_threads = false;
    bool expecting_alignmentdna = false;
    bool expecting_treenewick = false;
    
    for (unsigned i = 1; i < argc; ++i) {
        std::string option = argv[i];
        
        if (expecting_stateCount) {
            *stateCount = (unsigned)atoi(option.c_str());
            expecting_stateCount = false;
        } else if (expecting_ntaxa) {
            *ntaxa = (unsigned)atoi(option.c_str());
            expecting_ntaxa = false;
        } else if (expecting_nsites) {
            *nsites = (unsigned)atoi(option.c_str());
            expecting_nsites = false;
        } else if (expecting_rateCategoryCount) {
            *rateCategoryCount = (unsigned)atoi(option.c_str());
            expecting_rateCategoryCount = false;
        } else if (expecting_rsrc) {
            std::stringstream ss(option);
            int j;
            while (ss >> j) {
                rsrc->push_back(j);
                if (ss.peek() == ',')
                    ss.ignore();
            }
            expecting_rsrc = false;            
        } else if (expecting_nreps) {
            *nreps = (unsigned)atoi(option.c_str());
            expecting_nreps = false;
        } else if (expecting_compactTipCount) {
            *compactTipCount = (unsigned)atoi(option.c_str());
            expecting_compactTipCount = false;
        } else if (expecting_seed) {
            *randomSeed = (unsigned)atoi(option.c_str());
            expecting_seed = false;
        } else if (expecting_rescaleFrequency) {
            *rescaleFrequency = (unsigned)atoi(option.c_str());
            expecting_rescaleFrequency = false;
        } else if (expecting_eigenCount) {
            *eigenCount = (unsigned)atoi(option.c_str());
            expecting_eigenCount = false;
        } else if (expecting_partitions) {
            *partitions = (unsigned)atoi(option.c_str());
            expecting_partitions = false;
        } else if (expecting_threads) {
            *threadCount = (unsigned)atoi(option.c_str());
            expecting_threads = false;
        } else if (expecting_alignmentdna) {
            *alignmentdna = (char*) malloc(sizeof(char) * sizeof(option.c_str()));
            strcpy(*alignmentdna, option.c_str());
            expecting_alignmentdna = false;
        } else if (expecting_treenewick) {
            *treenewick = (char*) malloc(sizeof(char) * sizeof(option.c_str()));
            strcpy(*treenewick, option.c_str());
            expecting_treenewick = false;
        } else if (option == "--help") {
            helpMessage();
        } else if (option == "--resourcelist") {
            printResourceList();
        } else if (option == "--benchmarklist") {
            *benchmarklist = true;
        } else if (option == "--manualscale") {
            *manualScaling = true;
        } else if (option == "--autoscale") {
            *autoScaling = true;
        } else if (option == "--dynamicscale") {
            *dynamicScaling = true;
        } else if (option == "--doubleprecision") {
            *requireDoublePrecision = true;
        } else if (option == "--states") {
            expecting_stateCount = true;
        } else if (option == "--taxa") {
            expecting_ntaxa = true;
        } else if (option == "--sites") {
            expecting_nsites = true;
        } else if (option == "--rates") {
            expecting_rateCategoryCount = true;
        } else if (option == "--rsrc") {
            expecting_rsrc = true;
        } else if (option == "--reps") {
            expecting_nreps = true;
        } else if (option == "--compacttips") {
            expecting_compactTipCount = true;
        } else if (option == "--rescalefrequency") {
            expecting_rescaleFrequency = true;
        } else if (option == "--seed") {
            expecting_seed = true;
        } else if (option == "--fulltiming") {
            *fullTiming = true;
        } else if (option == "--disablevector") {
            *disableVector = true;
        } else if (option == "--enablethreads") {
            *enableThreads = true;
        } else if (option == "--unrooted") {
            *unrooted = true;
        } else if (option == "--calcderivs") {
            *calcderivs = true;
        } else if (option == "--logscalers") {
            *logscalers = true;
        } else if (option == "--eigencount") {
            expecting_eigenCount = true;
        } else if (option == "--eigencomplex") {
            *eigencomplex = true;
        } else if (option == "--ievectrans") {
            *ievectrans = true;
        } else if (option == "--setmatrix") {
            *setmatrix = true;
        } else if (option == "--opencl") {
            *opencl = true;
        } else if (option == "--partitions") {
            expecting_partitions = true;
        } else if (option == "--sitelikes") {
            *sitelikes = true;
        } else if (option == "--newdata") {
            *newDataPerRep = true;
        } else if (option == "--randomtree") {
            *randomTree = true;
        } else if (option == "--stdrand") {
            useStdlibRand = true;
        } else if (option == "--reroot") {
            *rerootTrees = true;
        } else if (option == "--pectinate") {
            *pectinate = true;
#ifdef HAVE_PLL
        } else if (option == "--plltest") {
            *pllTest = true;
        } else if (option == "--pllrepeats") {
            *pllSiteRepeats = true;
        } else if (option == "--pllonly") {
            *pllOnly = true;
            *pllTest = true;
#endif // HAVE_PLL
        } else if (option == "--multirsrc") {
            *multiRsrc = true;
        } else if (option == "--postorder") {
            *postorderTraversal = true;
        } else if (option == "--newtree") {
            *newTreePerRep = true;
        } else if (option == "--newparameters") {
            *newParametersPerRep = true;
        } else if (option == "--threadcount") {
            expecting_threads = true;
#ifdef HAVE_NCL
        } else if (option == "--alignmentdna") {
            expecting_alignmentdna = true;
        } else if (option == "--compress") {
            *compress = true;
        } else if (option == "--tree") {
            expecting_treenewick = true;
#endif // HAVE_NCL
        } else if (option == "--clientthreads") {
            *clientThreadingEnabled = true;
        } else {
            std::string msg("Unknown command line parameter \"");
            msg.append(option);         
            abort(msg.c_str());
        }
    }
    
    if (expecting_stateCount)
        abort("read last command line option without finding value associated with --states");
    
    if (expecting_ntaxa)
        abort("read last command line option without finding value associated with --taxa");
    
    if (expecting_nsites)
        abort("read last command line option without finding value associated with --sites");
    
    if (expecting_rateCategoryCount)
        abort("read last command line option without finding value associated with --rates");

    if (expecting_rsrc)
        abort("read last command line option without finding value associated with --rsrc");
    
    if (expecting_nreps)
        abort("read last command line option without finding value associated with --reps");
    
    if (expecting_seed)
        abort("read last command line option without finding value associated with --seed");
    
    if (expecting_rescaleFrequency)
        abort("read last command line option without finding value associated with --rescalefrequency");

    if (expecting_compactTipCount)
        abort("read last command line option without finding value associated with --compacttips");

    if (expecting_eigenCount)
        abort("read last command line option without finding value associated with --eigencount");

    if (expecting_partitions)
        abort("read last command line option without finding value associated with --partitions");

    if (*stateCount < 2)
        abort("invalid number of states supplied on the command line");
        
    if (*ntaxa < 2)
        abort("invalid number of taxa supplied on the command line");
      
    if (*nsites < 1)
        abort("invalid number of sites supplied on the command line");
    
    if (*rateCategoryCount < 1)
        abort("invalid number of rates supplied on the command line");
        
    if (*nreps < 1)
        abort("invalid number of reps supplied on the command line");

    if (*randomSeed < 1)
        abort("invalid number for seed supplied on the command line");   
        
    if (*manualScaling && *rescaleFrequency < 1)
        abort("invalid number for rescalefrequency supplied on the command line");   
    
    if (*compactTipCount < 0 || *compactTipCount > *ntaxa)
        abort("invalid number for compacttips supplied on the command line");
    
    if (*calcderivs && !(*unrooted))
        abort("calcderivs option requires unrooted tree option");
    
    if (*eigenCount < 1)
        abort("invalid number for eigencount supplied on the command line");
    
    if (*eigencomplex && (*stateCount != 4 || *eigenCount != 1))
        abort("eigencomplex option only works with stateCount=4 and eigenCount=1");

    if (*partitions < 1 || *partitions > *nsites)
        abort("invalid number for partitions supplied on the command line");

    if (*randomTree && (*eigenCount!=1 || *unrooted))
        abort("random tree topology can only be used with eigencount=1 and rooted trees");

    if (*partitions > 1 && *multiRsrc)
        abort("multiple resources cannot be used with partitioning");

    if (*manualScaling && *multiRsrc)
        abort("multiple resources cannot be used with scaling");

    if (*newDataPerRep && *multiRsrc)
        abort("multiple resources cannot be used with new data per replicate");

    if (*setmatrix && *multiRsrc)
        abort("multiple resources cannot be used with arbitrary transition matrix setting");

    if (*sitelikes && *multiRsrc)
        abort("multiple resources cannot be used with site likelihoods output");

    if (*postorderTraversal && (*randomTree==false && treenewick==NULL))
        abort("postorder traversal can only be used with randomtree option");

    if (*newTreePerRep && *randomTree==false)
        abort("new tree per replicate can only be used with randomtree option");

    if (*newTreePerRep && *eigenCount!=1)
        abort("new tree per replicate can only be used with eigencount=1");

    if (*newTreePerRep && *unrooted)
        abort("new tree per replicate can only be used with rooted trees");

    if (*clientThreadingEnabled && *multiRsrc==false)
        abort("client-side threading requires 'multirsrc' setting to be enabled");
}